

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

Vec4 __thiscall
rr::resolveMultisamplePixel(rr *this,MultisampleConstPixelBufferAccess *access,int x,int y)

{
  undefined4 uVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  Vector<float,_4> VVar4;
  Vec4 VVar5;
  undefined1 local_44 [24];
  int s;
  Vec4 sum;
  int y_local;
  int x_local;
  MultisampleConstPixelBufferAccess *access_local;
  
  sum.m_data[2] = (float)y;
  sum.m_data[3] = (float)x;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_44 + 0x14));
  local_44._16_4_ = 0;
  while( true ) {
    uVar1 = local_44._16_4_;
    iVar2 = MultisampleConstPixelBufferAccess::getNumSamples(access);
    if (iVar2 <= (int)uVar1) break;
    pCVar3 = MultisampleConstPixelBufferAccess::raw(access);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)local_44,(int)pCVar3,local_44._16_4_,(int)sum.m_data[3]);
    tcu::Vector<float,_4>::operator+=
              ((Vector<float,_4> *)(local_44 + 0x14),(Vector<float,_4> *)local_44);
    local_44._16_4_ = local_44._16_4_ + 1;
  }
  iVar2 = MultisampleConstPixelBufferAccess::getNumSamples(access);
  VVar4 = tcu::operator/((tcu *)this,(Vector<float,_4> *)(local_44 + 0x14),(float)iVar2);
  VVar5.m_data[0] = VVar4.m_data[0];
  VVar5.m_data[1] = VVar4.m_data[1];
  VVar5.m_data[2] = VVar4.m_data[2];
  VVar5.m_data[3] = VVar4.m_data[3];
  return (Vec4)VVar5.m_data;
}

Assistant:

tcu::Vec4 resolveMultisamplePixel (const MultisampleConstPixelBufferAccess& access, int x, int y)
{
	tcu::Vec4 sum;
	for (int s = 0; s < access.getNumSamples(); s++)
		sum += access.raw().getPixel(s, x, y);

	return sum / (float)access.getNumSamples();
}